

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

int write_dot_dot_entry(archive_write *a,mtree_entry_conflict *n)

{
  mtree_writer *mtree;
  ulong length;
  int iVar1;
  int iVar2;
  
  mtree = (mtree_writer *)a->format_data;
  if ((n->parentdir).s != (char *)0x0) {
    if ((mtree->indent != 0) && (0 < mtree->depth)) {
      iVar1 = mtree->depth * 4;
      iVar2 = 1;
      if (1 < iVar1) {
        iVar2 = iVar1;
      }
      do {
        archive_strappend_char(&mtree->buf,' ');
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    archive_string_sprintf(&mtree->buf,"# %s/%s\n",(n->parentdir).s,(n->basename).s);
  }
  if (mtree->indent == 0) {
    archive_strncat(&mtree->buf,"..\n\n",(ulong)(mtree->dironly == 0) + 3);
  }
  else {
    (mtree->ebuf).length = 0;
    archive_strncat(&mtree->ebuf,"..\n\n",(ulong)(mtree->dironly == 0) + 3);
    mtree_indent(mtree);
  }
  length = (mtree->buf).length;
  if (length < 0x8001) {
    iVar2 = 0;
  }
  else {
    iVar2 = __archive_write_output(a,(mtree->buf).s,length);
    (mtree->buf).length = 0;
  }
  return iVar2;
}

Assistant:

static int
write_dot_dot_entry(struct archive_write *a, struct mtree_entry *n)
{
	struct mtree_writer *mtree = a->format_data;
	int ret;

	if (n->parentdir.s) {
		if (mtree->indent) {
			int i, pd = mtree->depth * 4;
			for (i = 0; i < pd; i++)
				archive_strappend_char(&mtree->buf, ' ');
		}
		archive_string_sprintf(&mtree->buf, "# %s/%s\n",
			n->parentdir.s, n->basename.s);
	}

	if (mtree->indent) {
		archive_string_empty(&mtree->ebuf);
		archive_strncat(&mtree->ebuf, "..\n\n", (mtree->dironly)?3:4);
		mtree_indent(mtree);
	} else
		archive_strncat(&mtree->buf, "..\n\n", (mtree->dironly)?3:4);

	if (mtree->buf.length > 32768) {
		ret = __archive_write_output(
			a, mtree->buf.s, mtree->buf.length);
		archive_string_empty(&mtree->buf);
	} else
		ret = ARCHIVE_OK;
	return (ret);
}